

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tabs.cxx
# Opt level: O0

void __thiscall Fl_Tabs::client_area(Fl_Tabs *this,int *rx,int *ry,int *rw,int *rh,int tabh)

{
  int iVar1;
  Fl_Font font;
  Fl_Fontsize size;
  Fl_Widget *pFVar2;
  int local_38;
  int label_height;
  int y_offset;
  int tabh_local;
  int *rh_local;
  int *rw_local;
  int *ry_local;
  int *rx_local;
  Fl_Tabs *this_local;
  
  iVar1 = Fl_Group::children(&this->super_Fl_Group);
  if (iVar1 == 0) {
    font = Fl_Widget::labelfont((Fl_Widget *)this);
    size = Fl_Widget::labelsize((Fl_Widget *)this);
    iVar1 = fl_height(font,size);
    local_38 = iVar1 + 4;
    if ((tabh != 0) && (local_38 = tabh, tabh == -1)) {
      local_38 = -(iVar1 + 4);
    }
    iVar1 = Fl_Widget::x((Fl_Widget *)this);
    *rx = iVar1;
    iVar1 = Fl_Widget::w((Fl_Widget *)this);
    *rw = iVar1;
    if (local_38 < 0) {
      iVar1 = Fl_Widget::y((Fl_Widget *)this);
      *ry = iVar1;
      iVar1 = Fl_Widget::h((Fl_Widget *)this);
      *rh = iVar1 + local_38;
    }
    else {
      iVar1 = Fl_Widget::y((Fl_Widget *)this);
      *ry = iVar1 + local_38;
      iVar1 = Fl_Widget::h((Fl_Widget *)this);
      *rh = iVar1 - local_38;
    }
  }
  else {
    pFVar2 = Fl_Group::child(&this->super_Fl_Group,0);
    iVar1 = Fl_Widget::x(pFVar2);
    *rx = iVar1;
    pFVar2 = Fl_Group::child(&this->super_Fl_Group,0);
    iVar1 = Fl_Widget::y(pFVar2);
    *ry = iVar1;
    pFVar2 = Fl_Group::child(&this->super_Fl_Group,0);
    iVar1 = Fl_Widget::w(pFVar2);
    *rw = iVar1;
    pFVar2 = Fl_Group::child(&this->super_Fl_Group,0);
    iVar1 = Fl_Widget::h(pFVar2);
    *rh = iVar1;
  }
  return;
}

Assistant:

void Fl_Tabs::client_area(int &rx, int &ry, int &rw, int &rh, int tabh) {

  if (children()) {			// use existing values

    rx = child(0)->x();
    ry = child(0)->y();
    rw = child(0)->w();
    rh = child(0)->h();

  } else {				// calculate values

    int y_offset;
    int label_height = fl_height(labelfont(), labelsize()) + BORDER*2;

    if (tabh == 0)			// use default (at top)
      y_offset = label_height;
    else if (tabh == -1)	 	// use default (at bottom)
      y_offset = -label_height;
    else
      y_offset = tabh;			// user given value

    rx = x();
    rw = w();

    if (y_offset >= 0) {		// labels at top
      ry = y() + y_offset;
      rh = h() - y_offset;
    } else {				// labels at bottom
      ry = y();
      rh = h() + y_offset;
    }
  }
}